

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

int tcu::astc::anon_unknown_0::computeNumRequiredBits(ISEParams *iseParams,int numValues)

{
  ISEMode IVar1;
  deInt32 dVar2;
  int numValues_local;
  ISEParams *iseParams_local;
  
  IVar1 = iseParams->mode;
  if (IVar1 == ISEMODE_TRIT) {
    dVar2 = deDivRoundUp32(numValues << 3,5);
    iseParams_local._4_4_ = dVar2 + numValues * iseParams->numBits;
  }
  else if (IVar1 == ISEMODE_QUINT) {
    dVar2 = deDivRoundUp32(numValues * 7,3);
    iseParams_local._4_4_ = dVar2 + numValues * iseParams->numBits;
  }
  else if (IVar1 == ISEMODE_PLAIN_BIT) {
    iseParams_local._4_4_ = numValues * iseParams->numBits;
  }
  else {
    iseParams_local._4_4_ = -1;
  }
  return iseParams_local._4_4_;
}

Assistant:

inline int computeNumRequiredBits (const ISEParams& iseParams, int numValues)
{
	switch (iseParams.mode)
	{
		case ISEMODE_TRIT:			return deDivRoundUp32(numValues*8, 5) + numValues*iseParams.numBits;
		case ISEMODE_QUINT:			return deDivRoundUp32(numValues*7, 3) + numValues*iseParams.numBits;
		case ISEMODE_PLAIN_BIT:		return numValues*iseParams.numBits;
		default:
			DE_ASSERT(false);
			return -1;
	}
}